

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::avx2::
     BVHNIntersectorKHybrid<8,_8,_16777232,_true,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::TriangleMvMBIntersectorKPluecker<4,_8,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray
                ,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  RTCFilterFunctionN p_Var3;
  undefined1 auVar4 [32];
  byte bVar5;
  undefined1 auVar6 [32];
  ulong uVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  int iVar12;
  AABBNodeMB4D *node1;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  Geometry *pGVar16;
  uint uVar17;
  ulong uVar18;
  ulong *puVar19;
  Scene *pSVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [64];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  float fVar65;
  float fVar70;
  float fVar71;
  float fVar72;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar80;
  float fVar81;
  float fVar82;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar95;
  float fVar96;
  float fVar97;
  undefined1 auVar94 [16];
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar111;
  float fVar112;
  float fVar113;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  float fVar114;
  float fVar115;
  float fVar116;
  undefined1 auVar117 [16];
  undefined1 auVar118 [64];
  undefined1 auVar119 [64];
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  undefined1 local_1699;
  ulong *local_1698;
  long local_1690;
  undefined8 uStack_1688;
  undefined1 local_1680 [16];
  undefined1 local_1670 [16];
  undefined1 local_1660 [16];
  undefined1 local_1650 [16];
  undefined1 local_1640 [16];
  undefined1 local_1630 [16];
  undefined8 local_1620;
  float fStack_1618;
  float fStack_1614;
  undefined1 local_1610 [16];
  undefined1 local_1600 [16];
  long local_15e8;
  long local_15e0;
  ulong local_15d8;
  RTCFilterFunctionNArguments local_15d0;
  undefined1 local_15a0 [32];
  undefined1 local_1580 [16];
  undefined1 local_1570 [16];
  undefined1 local_1560 [16];
  float local_1550;
  float fStack_154c;
  float fStack_1548;
  float fStack_1544;
  undefined1 local_1540 [16];
  undefined1 local_1530 [16];
  undefined1 *local_1520;
  undefined1 local_1510 [16];
  undefined1 local_1500 [16];
  undefined1 local_14f0 [16];
  undefined1 local_14e0 [16];
  undefined1 local_14d0 [16];
  undefined1 local_14c0 [16];
  undefined1 local_14b0 [16];
  undefined1 local_14a0 [32];
  undefined1 local_1480 [32];
  undefined1 local_1460 [32];
  float local_1440;
  float fStack_143c;
  float fStack_1438;
  float fStack_1434;
  float fStack_1430;
  float fStack_142c;
  float fStack_1428;
  float fStack_1424;
  float local_1420;
  float fStack_141c;
  float fStack_1418;
  float fStack_1414;
  float fStack_1410;
  float fStack_140c;
  float fStack_1408;
  float fStack_1404;
  float local_1400;
  float fStack_13fc;
  float fStack_13f8;
  float fStack_13f4;
  float fStack_13f0;
  float fStack_13ec;
  float fStack_13e8;
  float fStack_13e4;
  float local_13e0;
  float fStack_13dc;
  float fStack_13d8;
  float fStack_13d4;
  float fStack_13d0;
  float fStack_13cc;
  float fStack_13c8;
  float fStack_13c4;
  float local_13c0;
  float fStack_13bc;
  float fStack_13b8;
  float fStack_13b4;
  float fStack_13b0;
  float fStack_13ac;
  float fStack_13a8;
  float fStack_13a4;
  float local_13a0;
  float fStack_139c;
  float fStack_1398;
  float fStack_1394;
  float fStack_1390;
  float fStack_138c;
  float fStack_1388;
  float fStack_1384;
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  RTCHitN local_1320 [32];
  undefined1 local_1300 [32];
  undefined1 local_12e0 [32];
  undefined4 local_12c0;
  undefined4 uStack_12bc;
  undefined4 uStack_12b8;
  undefined4 uStack_12b4;
  undefined4 uStack_12b0;
  undefined4 uStack_12ac;
  undefined4 uStack_12a8;
  undefined4 uStack_12a4;
  undefined4 local_12a0;
  undefined4 uStack_129c;
  undefined4 uStack_1298;
  undefined4 uStack_1294;
  undefined4 uStack_1290;
  undefined4 uStack_128c;
  undefined4 uStack_1288;
  undefined4 uStack_1284;
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  uint local_1240;
  uint uStack_123c;
  uint uStack_1238;
  uint uStack_1234;
  uint uStack_1230;
  uint uStack_122c;
  uint uStack_1228;
  uint uStack_1224;
  uint local_1220;
  uint uStack_121c;
  uint uStack_1218;
  uint uStack_1214;
  uint uStack_1210;
  uint uStack_120c;
  uint uStack_1208;
  uint uStack_1204;
  size_t local_1200;
  ulong local_11f8 [569];
  
  local_1200 = root.ptr;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_1340._4_4_ = uVar1;
  local_1340._0_4_ = uVar1;
  local_1340._8_4_ = uVar1;
  local_1340._12_4_ = uVar1;
  local_1340._16_4_ = uVar1;
  local_1340._20_4_ = uVar1;
  local_1340._24_4_ = uVar1;
  local_1340._28_4_ = uVar1;
  auVar57 = ZEXT3264(local_1340);
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_1360._4_4_ = uVar1;
  local_1360._0_4_ = uVar1;
  local_1360._8_4_ = uVar1;
  local_1360._12_4_ = uVar1;
  local_1360._16_4_ = uVar1;
  local_1360._20_4_ = uVar1;
  local_1360._24_4_ = uVar1;
  local_1360._28_4_ = uVar1;
  auVar63 = ZEXT3264(local_1360);
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  local_1380._4_4_ = uVar1;
  local_1380._0_4_ = uVar1;
  local_1380._8_4_ = uVar1;
  local_1380._12_4_ = uVar1;
  local_1380._16_4_ = uVar1;
  local_1380._20_4_ = uVar1;
  local_1380._24_4_ = uVar1;
  local_1380._28_4_ = uVar1;
  auVar64 = ZEXT3264(local_1380);
  fVar93 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar101 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar108 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  fVar65 = fVar93 * 0.99999964;
  fVar76 = fVar101 * 0.99999964;
  fVar86 = fVar108 * 0.99999964;
  fVar93 = fVar93 * 1.0000004;
  fVar101 = fVar101 * 1.0000004;
  fVar108 = fVar108 * 1.0000004;
  uVar21 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_15d8 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar15 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  uVar24 = uVar21 ^ 0x20;
  uVar22 = local_15d8 ^ 0x20;
  iVar12 = (tray->tnear).field_0.i[k];
  local_1460._4_4_ = iVar12;
  local_1460._0_4_ = iVar12;
  local_1460._8_4_ = iVar12;
  local_1460._12_4_ = iVar12;
  local_1460._16_4_ = iVar12;
  local_1460._20_4_ = iVar12;
  local_1460._24_4_ = iVar12;
  local_1460._28_4_ = iVar12;
  auVar118 = ZEXT3264(local_1460);
  iVar12 = (tray->tfar).field_0.i[k];
  local_1480._4_4_ = iVar12;
  local_1480._0_4_ = iVar12;
  local_1480._8_4_ = iVar12;
  local_1480._12_4_ = iVar12;
  local_1480._16_4_ = iVar12;
  local_1480._20_4_ = iVar12;
  local_1480._24_4_ = iVar12;
  local_1480._28_4_ = iVar12;
  auVar119 = ZEXT3264(local_1480);
  iVar12 = 1 << ((uint)k & 0x1f);
  auVar30._4_4_ = iVar12;
  auVar30._0_4_ = iVar12;
  auVar30._8_4_ = iVar12;
  auVar30._12_4_ = iVar12;
  auVar30._16_4_ = iVar12;
  auVar30._20_4_ = iVar12;
  auVar30._24_4_ = iVar12;
  auVar30._28_4_ = iVar12;
  auVar6 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar30 = vpand_avx2(auVar30,auVar6);
  local_14a0 = vpcmpeqd_avx2(auVar30,auVar6);
  local_13a0 = fVar65;
  fStack_139c = fVar65;
  fStack_1398 = fVar65;
  fStack_1394 = fVar65;
  fStack_1390 = fVar65;
  fStack_138c = fVar65;
  fStack_1388 = fVar65;
  fStack_1384 = fVar65;
  local_13c0 = fVar76;
  fStack_13bc = fVar76;
  fStack_13b8 = fVar76;
  fStack_13b4 = fVar76;
  fStack_13b0 = fVar76;
  fStack_13ac = fVar76;
  fStack_13a8 = fVar76;
  fStack_13a4 = fVar76;
  local_13e0 = fVar86;
  fStack_13dc = fVar86;
  fStack_13d8 = fVar86;
  fStack_13d4 = fVar86;
  fStack_13d0 = fVar86;
  fStack_13cc = fVar86;
  fStack_13c8 = fVar86;
  fStack_13c4 = fVar86;
  local_1400 = fVar93;
  fStack_13fc = fVar93;
  fStack_13f8 = fVar93;
  fStack_13f4 = fVar93;
  fStack_13f0 = fVar93;
  fStack_13ec = fVar93;
  fStack_13e8 = fVar93;
  fStack_13e4 = fVar93;
  local_1420 = fVar101;
  fStack_141c = fVar101;
  fStack_1418 = fVar101;
  fStack_1414 = fVar101;
  fStack_1410 = fVar101;
  fStack_140c = fVar101;
  fStack_1408 = fVar101;
  fStack_1404 = fVar101;
  local_1440 = fVar108;
  fStack_143c = fVar108;
  fStack_1438 = fVar108;
  fStack_1434 = fVar108;
  fStack_1430 = fVar108;
  fStack_142c = fVar108;
  fStack_1428 = fVar108;
  fStack_1424 = fVar108;
  local_1698 = local_11f8;
  fVar70 = fVar65;
  fVar71 = fVar65;
  fVar72 = fVar65;
  fVar73 = fVar65;
  fVar74 = fVar65;
  fVar75 = fVar65;
  fVar80 = fVar76;
  fVar81 = fVar76;
  fVar82 = fVar76;
  fVar83 = fVar76;
  fVar84 = fVar76;
  fVar85 = fVar76;
  fVar87 = fVar86;
  fVar88 = fVar86;
  fVar89 = fVar86;
  fVar90 = fVar86;
  fVar91 = fVar86;
  fVar92 = fVar86;
  fVar95 = fVar93;
  fVar96 = fVar93;
  fVar97 = fVar93;
  fVar98 = fVar93;
  fVar99 = fVar93;
  fVar100 = fVar93;
  fVar102 = fVar101;
  fVar103 = fVar101;
  fVar104 = fVar101;
  fVar105 = fVar101;
  fVar106 = fVar101;
  fVar107 = fVar101;
  fVar111 = fVar108;
  fVar112 = fVar108;
  fVar113 = fVar108;
  fVar114 = fVar108;
  fVar115 = fVar108;
  fVar116 = fVar108;
LAB_016cf487:
  do {
    puVar19 = local_1698;
    if (puVar19 == &local_1200) {
LAB_016cfee0:
      return puVar19 != &local_1200;
    }
    local_1698 = puVar19 + -1;
    uVar23 = puVar19[-1];
    while ((uVar23 & 8) == 0) {
      uVar1 = *(undefined4 *)(ray + k * 4 + 0xe0);
      auVar31._4_4_ = uVar1;
      auVar31._0_4_ = uVar1;
      auVar31._8_4_ = uVar1;
      auVar31._12_4_ = uVar1;
      auVar31._16_4_ = uVar1;
      auVar31._20_4_ = uVar1;
      auVar31._24_4_ = uVar1;
      auVar31._28_4_ = uVar1;
      uVar13 = uVar23 & 0xfffffffffffffff0;
      auVar53 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar13 + 0x100 + uVar21),auVar31,
                                *(undefined1 (*) [32])(uVar13 + 0x40 + uVar21));
      auVar30 = vsubps_avx(ZEXT1632(auVar53),auVar57._0_32_);
      auVar6._4_4_ = fVar70 * auVar30._4_4_;
      auVar6._0_4_ = fVar65 * auVar30._0_4_;
      auVar6._8_4_ = fVar71 * auVar30._8_4_;
      auVar6._12_4_ = fVar72 * auVar30._12_4_;
      auVar6._16_4_ = fVar73 * auVar30._16_4_;
      auVar6._20_4_ = fVar74 * auVar30._20_4_;
      auVar6._24_4_ = fVar75 * auVar30._24_4_;
      auVar6._28_4_ = auVar30._28_4_;
      auVar30 = vmaxps_avx(auVar118._0_32_,auVar6);
      auVar53 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar13 + 0x100 + local_15d8),auVar31,
                                *(undefined1 (*) [32])(uVar13 + 0x40 + local_15d8));
      auVar6 = vsubps_avx(ZEXT1632(auVar53),auVar63._0_32_);
      auVar4._4_4_ = fVar80 * auVar6._4_4_;
      auVar4._0_4_ = fVar76 * auVar6._0_4_;
      auVar4._8_4_ = fVar81 * auVar6._8_4_;
      auVar4._12_4_ = fVar82 * auVar6._12_4_;
      auVar4._16_4_ = fVar83 * auVar6._16_4_;
      auVar4._20_4_ = fVar84 * auVar6._20_4_;
      auVar4._24_4_ = fVar85 * auVar6._24_4_;
      auVar4._28_4_ = auVar6._28_4_;
      auVar53 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar13 + 0x100 + uVar15),auVar31,
                                *(undefined1 (*) [32])(uVar13 + 0x40 + uVar15));
      auVar6 = vsubps_avx(ZEXT1632(auVar53),auVar64._0_32_);
      auVar8._4_4_ = fVar87 * auVar6._4_4_;
      auVar8._0_4_ = fVar86 * auVar6._0_4_;
      auVar8._8_4_ = fVar88 * auVar6._8_4_;
      auVar8._12_4_ = fVar89 * auVar6._12_4_;
      auVar8._16_4_ = fVar90 * auVar6._16_4_;
      auVar8._20_4_ = fVar91 * auVar6._20_4_;
      auVar8._24_4_ = fVar92 * auVar6._24_4_;
      auVar8._28_4_ = auVar6._28_4_;
      auVar6 = vmaxps_avx(auVar4,auVar8);
      auVar30 = vmaxps_avx(auVar30,auVar6);
      auVar53 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar13 + 0x100 + uVar24),auVar31,
                                *(undefined1 (*) [32])(uVar13 + 0x40 + uVar24));
      auVar6 = vsubps_avx(ZEXT1632(auVar53),auVar57._0_32_);
      auVar9._4_4_ = fVar95 * auVar6._4_4_;
      auVar9._0_4_ = fVar93 * auVar6._0_4_;
      auVar9._8_4_ = fVar96 * auVar6._8_4_;
      auVar9._12_4_ = fVar97 * auVar6._12_4_;
      auVar9._16_4_ = fVar98 * auVar6._16_4_;
      auVar9._20_4_ = fVar99 * auVar6._20_4_;
      auVar9._24_4_ = fVar100 * auVar6._24_4_;
      auVar9._28_4_ = auVar6._28_4_;
      auVar6 = vminps_avx(auVar119._0_32_,auVar9);
      auVar53 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar13 + 0x100 + uVar22),auVar31,
                                *(undefined1 (*) [32])(uVar13 + 0x40 + uVar22));
      auVar4 = vsubps_avx(ZEXT1632(auVar53),auVar63._0_32_);
      auVar53 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar13 + 0x100 + (uVar15 ^ 0x20)),auVar31,
                                *(undefined1 (*) [32])(uVar13 + 0x40 + (uVar15 ^ 0x20)));
      auVar10._4_4_ = fVar102 * auVar4._4_4_;
      auVar10._0_4_ = fVar101 * auVar4._0_4_;
      auVar10._8_4_ = fVar103 * auVar4._8_4_;
      auVar10._12_4_ = fVar104 * auVar4._12_4_;
      auVar10._16_4_ = fVar105 * auVar4._16_4_;
      auVar10._20_4_ = fVar106 * auVar4._20_4_;
      auVar10._24_4_ = fVar107 * auVar4._24_4_;
      auVar10._28_4_ = auVar4._28_4_;
      auVar4 = vsubps_avx(ZEXT1632(auVar53),auVar64._0_32_);
      auVar11._4_4_ = fVar111 * auVar4._4_4_;
      auVar11._0_4_ = fVar108 * auVar4._0_4_;
      auVar11._8_4_ = fVar112 * auVar4._8_4_;
      auVar11._12_4_ = fVar113 * auVar4._12_4_;
      auVar11._16_4_ = fVar114 * auVar4._16_4_;
      auVar11._20_4_ = fVar115 * auVar4._20_4_;
      auVar11._24_4_ = fVar116 * auVar4._24_4_;
      auVar11._28_4_ = auVar4._28_4_;
      auVar4 = vminps_avx(auVar10,auVar11);
      auVar6 = vminps_avx(auVar6,auVar4);
      auVar30 = vcmpps_avx(auVar30,auVar6,2);
      if (((uint)uVar23 & 7) == 6) {
        auVar6 = vcmpps_avx(*(undefined1 (*) [32])(uVar13 + 0x1c0),auVar31,2);
        auVar4 = vcmpps_avx(auVar31,*(undefined1 (*) [32])(uVar13 + 0x1e0),1);
        auVar6 = vandps_avx(auVar6,auVar4);
        auVar30 = vandps_avx(auVar6,auVar30);
        auVar53 = vpackssdw_avx(auVar30._0_16_,auVar30._16_16_);
      }
      else {
        auVar53 = vpackssdw_avx(auVar30._0_16_,auVar30._16_16_);
      }
      auVar25 = vpsllw_avx(auVar53,0xf);
      auVar53 = vpacksswb_avx(auVar25,auVar25);
      bVar5 = SUB161(auVar53 >> 7,0) & 1 | (SUB161(auVar53 >> 0xf,0) & 1) << 1 |
              (SUB161(auVar53 >> 0x17,0) & 1) << 2 | (SUB161(auVar53 >> 0x1f,0) & 1) << 3 |
              (SUB161(auVar53 >> 0x27,0) & 1) << 4 | (SUB161(auVar53 >> 0x2f,0) & 1) << 5 |
              (SUB161(auVar53 >> 0x37,0) & 1) << 6 | SUB161(auVar53 >> 0x3f,0) << 7;
      if ((((((((auVar25 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar25 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar25 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar25 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar25 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar25 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar25 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar25[0xf])
      goto LAB_016cf487;
      lVar14 = 0;
      for (uVar23 = (ulong)bVar5; (uVar23 & 1) == 0; uVar23 = uVar23 >> 1 | 0x8000000000000000) {
        lVar14 = lVar14 + 1;
      }
      uVar23 = *(ulong *)(uVar13 + lVar14 * 8);
      uVar17 = bVar5 - 1 & (uint)bVar5;
      uVar18 = (ulong)uVar17;
      if (uVar17 != 0) {
        do {
          *local_1698 = uVar23;
          local_1698 = local_1698 + 1;
          lVar14 = 0;
          for (uVar23 = uVar18; (uVar23 & 1) == 0; uVar23 = uVar23 >> 1 | 0x8000000000000000) {
            lVar14 = lVar14 + 1;
          }
          uVar18 = uVar18 - 1 & uVar18;
          uVar23 = *(ulong *)(uVar13 + lVar14 * 8);
        } while (uVar18 != 0);
      }
    }
    local_15e0 = (ulong)((uint)uVar23 & 0xf) - 8;
    uVar23 = uVar23 & 0xfffffffffffffff0;
    for (local_15e8 = 0; local_15e8 != local_15e0; local_15e8 = local_15e8 + 1) {
      lVar14 = local_15e8 * 0x140;
      uVar1 = *(undefined4 *)(ray + k * 4 + 0xe0);
      auVar45._4_4_ = uVar1;
      auVar45._0_4_ = uVar1;
      auVar45._8_4_ = uVar1;
      auVar45._12_4_ = uVar1;
      auVar53 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar23 + 0x90 + lVar14),auVar45,
                                *(undefined1 (*) [16])(uVar23 + lVar14));
      auVar25 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar23 + 0xa0 + lVar14),auVar45,
                                *(undefined1 (*) [16])(uVar23 + 0x10 + lVar14));
      auVar38 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar23 + 0xb0 + lVar14),auVar45,
                                *(undefined1 (*) [16])(uVar23 + 0x20 + lVar14));
      auVar51 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar23 + 0xc0 + lVar14),auVar45,
                                *(undefined1 (*) [16])(uVar23 + 0x30 + lVar14));
      auVar52 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar23 + 0xd0 + lVar14),auVar45,
                                *(undefined1 (*) [16])(uVar23 + 0x40 + lVar14));
      auVar33 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar23 + 0xe0 + lVar14),auVar45,
                                *(undefined1 (*) [16])(uVar23 + 0x50 + lVar14));
      auVar47 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar23 + 0xf0 + lVar14),auVar45,
                                *(undefined1 (*) [16])(uVar23 + 0x60 + lVar14));
      auVar58 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar23 + 0x100 + lVar14),auVar45,
                                *(undefined1 (*) [16])(uVar23 + 0x70 + lVar14));
      auVar26 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar23 + 0x110 + lVar14),auVar45,
                                *(undefined1 (*) [16])(uVar23 + 0x80 + lVar14));
      uVar1 = *(undefined4 *)(ray + k * 4);
      auVar46._4_4_ = uVar1;
      auVar46._0_4_ = uVar1;
      auVar46._8_4_ = uVar1;
      auVar46._12_4_ = uVar1;
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar109._4_4_ = uVar1;
      auVar109._0_4_ = uVar1;
      auVar109._8_4_ = uVar1;
      auVar109._12_4_ = uVar1;
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x40);
      auVar117._4_4_ = uVar1;
      auVar117._0_4_ = uVar1;
      auVar117._8_4_ = uVar1;
      auVar117._12_4_ = uVar1;
      local_1600 = vsubps_avx(auVar53,auVar46);
      local_1610 = vsubps_avx(auVar25,auVar109);
      local_1630 = vsubps_avx(auVar38,auVar117);
      auVar53 = vsubps_avx(auVar51,auVar46);
      auVar25 = vsubps_avx(auVar52,auVar109);
      auVar38 = vsubps_avx(auVar33,auVar117);
      auVar51 = vsubps_avx(auVar47,auVar46);
      auVar52 = vsubps_avx(auVar58,auVar109);
      auVar33 = vsubps_avx(auVar26,auVar117);
      local_1640 = vsubps_avx(auVar51,local_1600);
      local_1660 = vsubps_avx(auVar52,local_1610);
      local_1650 = vsubps_avx(auVar33,local_1630);
      auVar26._0_4_ = auVar51._0_4_ + local_1600._0_4_;
      auVar26._4_4_ = auVar51._4_4_ + local_1600._4_4_;
      auVar26._8_4_ = auVar51._8_4_ + local_1600._8_4_;
      auVar26._12_4_ = auVar51._12_4_ + local_1600._12_4_;
      auVar42._0_4_ = auVar52._0_4_ + local_1610._0_4_;
      auVar42._4_4_ = auVar52._4_4_ + local_1610._4_4_;
      auVar42._8_4_ = auVar52._8_4_ + local_1610._8_4_;
      auVar42._12_4_ = auVar52._12_4_ + local_1610._12_4_;
      fVar93 = local_1630._0_4_;
      auVar47._0_4_ = auVar33._0_4_ + fVar93;
      fVar101 = local_1630._4_4_;
      auVar47._4_4_ = auVar33._4_4_ + fVar101;
      fVar108 = local_1630._8_4_;
      auVar47._8_4_ = auVar33._8_4_ + fVar108;
      fVar65 = local_1630._12_4_;
      auVar47._12_4_ = auVar33._12_4_ + fVar65;
      auVar110._0_4_ = local_1650._0_4_ * auVar42._0_4_;
      auVar110._4_4_ = local_1650._4_4_ * auVar42._4_4_;
      auVar110._8_4_ = local_1650._8_4_ * auVar42._8_4_;
      auVar110._12_4_ = local_1650._12_4_ * auVar42._12_4_;
      auVar58 = vfmsub231ps_fma(auVar110,local_1660,auVar47);
      auVar48._0_4_ = auVar47._0_4_ * local_1640._0_4_;
      auVar48._4_4_ = auVar47._4_4_ * local_1640._4_4_;
      auVar48._8_4_ = auVar47._8_4_ * local_1640._8_4_;
      auVar48._12_4_ = auVar47._12_4_ * local_1640._12_4_;
      auVar47 = vfmsub231ps_fma(auVar48,local_1650,auVar26);
      auVar27._0_4_ = local_1660._0_4_ * auVar26._0_4_;
      auVar27._4_4_ = local_1660._4_4_ * auVar26._4_4_;
      auVar27._8_4_ = local_1660._8_4_ * auVar26._8_4_;
      auVar27._12_4_ = local_1660._12_4_ * auVar26._12_4_;
      auVar26 = vfmsub231ps_fma(auVar27,local_1640,auVar42);
      local_1620._4_4_ = *(float *)(ray + k * 4 + 0xc0);
      auVar77._0_4_ = auVar26._0_4_ * local_1620._4_4_;
      auVar77._4_4_ = auVar26._4_4_ * local_1620._4_4_;
      auVar77._8_4_ = auVar26._8_4_ * local_1620._4_4_;
      auVar77._12_4_ = auVar26._12_4_ * local_1620._4_4_;
      uVar1 = *(undefined4 *)(ray + k * 4 + 0xa0);
      auVar94._4_4_ = uVar1;
      auVar94._0_4_ = uVar1;
      auVar94._8_4_ = uVar1;
      auVar94._12_4_ = uVar1;
      auVar47 = vfmadd231ps_fma(auVar77,auVar94,auVar47);
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
      local_1680._4_4_ = uVar1;
      local_1680._0_4_ = uVar1;
      local_1680._8_4_ = uVar1;
      local_1680._12_4_ = uVar1;
      local_1570 = vfmadd231ps_fma(auVar47,local_1680,auVar58);
      auVar47 = vsubps_avx(local_1610,auVar25);
      local_1560 = vsubps_avx(local_1630,auVar38);
      auVar43._0_4_ = local_1610._0_4_ + auVar25._0_4_;
      auVar43._4_4_ = local_1610._4_4_ + auVar25._4_4_;
      auVar43._8_4_ = local_1610._8_4_ + auVar25._8_4_;
      auVar43._12_4_ = local_1610._12_4_ + auVar25._12_4_;
      auVar49._0_4_ = fVar93 + auVar38._0_4_;
      auVar49._4_4_ = fVar101 + auVar38._4_4_;
      auVar49._8_4_ = fVar108 + auVar38._8_4_;
      auVar49._12_4_ = fVar65 + auVar38._12_4_;
      fVar76 = local_1560._0_4_;
      auVar58._0_4_ = auVar43._0_4_ * fVar76;
      fVar71 = local_1560._4_4_;
      auVar58._4_4_ = auVar43._4_4_ * fVar71;
      fVar74 = local_1560._8_4_;
      auVar58._8_4_ = auVar43._8_4_ * fVar74;
      fVar81 = local_1560._12_4_;
      auVar58._12_4_ = auVar43._12_4_ * fVar81;
      auVar27 = vfmsub231ps_fma(auVar58,auVar47,auVar49);
      auVar58 = vsubps_avx(local_1600,auVar53);
      fVar86 = auVar58._0_4_;
      auVar50._0_4_ = auVar49._0_4_ * fVar86;
      fVar72 = auVar58._4_4_;
      auVar50._4_4_ = auVar49._4_4_ * fVar72;
      fVar75 = auVar58._8_4_;
      auVar50._8_4_ = auVar49._8_4_ * fVar75;
      fVar82 = auVar58._12_4_;
      auVar50._12_4_ = auVar49._12_4_ * fVar82;
      auVar66._0_4_ = local_1600._0_4_ + auVar53._0_4_;
      auVar66._4_4_ = local_1600._4_4_ + auVar53._4_4_;
      auVar66._8_4_ = local_1600._8_4_ + auVar53._8_4_;
      auVar66._12_4_ = local_1600._12_4_ + auVar53._12_4_;
      auVar26 = vfmsub231ps_fma(auVar50,local_1560,auVar66);
      fVar70 = auVar47._0_4_;
      auVar67._0_4_ = auVar66._0_4_ * fVar70;
      fVar73 = auVar47._4_4_;
      auVar67._4_4_ = auVar66._4_4_ * fVar73;
      fVar80 = auVar47._8_4_;
      auVar67._8_4_ = auVar66._8_4_ * fVar80;
      fVar83 = auVar47._12_4_;
      auVar67._12_4_ = auVar66._12_4_ * fVar83;
      auVar32 = vfmsub231ps_fma(auVar67,auVar58,auVar43);
      auVar44._0_4_ = auVar32._0_4_ * local_1620._4_4_;
      auVar44._4_4_ = auVar32._4_4_ * local_1620._4_4_;
      auVar44._8_4_ = auVar32._8_4_ * local_1620._4_4_;
      auVar44._12_4_ = auVar32._12_4_ * local_1620._4_4_;
      auVar26 = vfmadd231ps_fma(auVar44,auVar94,auVar26);
      local_1540 = vfmadd231ps_fma(auVar26,local_1680,auVar27);
      auVar26 = vsubps_avx(auVar53,auVar51);
      auVar37._0_4_ = auVar53._0_4_ + auVar51._0_4_;
      auVar37._4_4_ = auVar53._4_4_ + auVar51._4_4_;
      auVar37._8_4_ = auVar53._8_4_ + auVar51._8_4_;
      auVar37._12_4_ = auVar53._12_4_ + auVar51._12_4_;
      auVar51 = vsubps_avx(auVar25,auVar52);
      auVar32._0_4_ = auVar25._0_4_ + auVar52._0_4_;
      auVar32._4_4_ = auVar25._4_4_ + auVar52._4_4_;
      auVar32._8_4_ = auVar25._8_4_ + auVar52._8_4_;
      auVar32._12_4_ = auVar25._12_4_ + auVar52._12_4_;
      auVar52 = vsubps_avx(auVar38,auVar33);
      auVar53._0_4_ = auVar38._0_4_ + auVar33._0_4_;
      auVar53._4_4_ = auVar38._4_4_ + auVar33._4_4_;
      auVar53._8_4_ = auVar38._8_4_ + auVar33._8_4_;
      auVar53._12_4_ = auVar38._12_4_ + auVar33._12_4_;
      auVar25._0_4_ = auVar52._0_4_ * auVar32._0_4_;
      auVar25._4_4_ = auVar52._4_4_ * auVar32._4_4_;
      auVar25._8_4_ = auVar52._8_4_ * auVar32._8_4_;
      auVar25._12_4_ = auVar52._12_4_ * auVar32._12_4_;
      auVar25 = vfmsub231ps_fma(auVar25,auVar51,auVar53);
      auVar54._0_4_ = auVar53._0_4_ * auVar26._0_4_;
      auVar54._4_4_ = auVar53._4_4_ * auVar26._4_4_;
      auVar54._8_4_ = auVar53._8_4_ * auVar26._8_4_;
      auVar54._12_4_ = auVar53._12_4_ * auVar26._12_4_;
      auVar53 = vfmsub231ps_fma(auVar54,auVar52,auVar37);
      auVar38._0_4_ = auVar51._0_4_ * auVar37._0_4_;
      auVar38._4_4_ = auVar51._4_4_ * auVar37._4_4_;
      auVar38._8_4_ = auVar51._8_4_ * auVar37._8_4_;
      auVar38._12_4_ = auVar51._12_4_ * auVar37._12_4_;
      auVar38 = vfmsub231ps_fma(auVar38,auVar26,auVar32);
      local_1620._0_4_ = local_1620._4_4_;
      fStack_1618 = local_1620._4_4_;
      fStack_1614 = local_1620._4_4_;
      auVar33._0_4_ = auVar38._0_4_ * local_1620._4_4_;
      auVar33._4_4_ = auVar38._4_4_ * local_1620._4_4_;
      auVar33._8_4_ = auVar38._8_4_ * local_1620._4_4_;
      auVar33._12_4_ = auVar38._12_4_ * local_1620._4_4_;
      auVar53 = vfmadd231ps_fma(auVar33,auVar94,auVar53);
      auVar38 = vfmadd231ps_fma(auVar53,local_1680,auVar25);
      local_1550 = local_1570._0_4_;
      fStack_154c = local_1570._4_4_;
      fStack_1548 = local_1570._8_4_;
      fStack_1544 = local_1570._12_4_;
      local_1530._0_4_ = auVar38._0_4_ + local_1550 + local_1540._0_4_;
      local_1530._4_4_ = auVar38._4_4_ + fStack_154c + local_1540._4_4_;
      local_1530._8_4_ = auVar38._8_4_ + fStack_1548 + local_1540._8_4_;
      local_1530._12_4_ = auVar38._12_4_ + fStack_1544 + local_1540._12_4_;
      auVar39._8_4_ = 0x7fffffff;
      auVar39._0_8_ = 0x7fffffff7fffffff;
      auVar39._12_4_ = 0x7fffffff;
      auVar53 = vminps_avx(local_1570,local_1540);
      auVar53 = vminps_avx(auVar53,auVar38);
      local_1580 = vandps_avx(local_1530,auVar39);
      auVar68._0_4_ = local_1580._0_4_ * 1.1920929e-07;
      auVar68._4_4_ = local_1580._4_4_ * 1.1920929e-07;
      auVar68._8_4_ = local_1580._8_4_ * 1.1920929e-07;
      auVar68._12_4_ = local_1580._12_4_ * 1.1920929e-07;
      uVar13 = CONCAT44(auVar68._4_4_,auVar68._0_4_);
      auVar59._0_8_ = uVar13 ^ 0x8000000080000000;
      auVar59._8_4_ = -auVar68._8_4_;
      auVar59._12_4_ = -auVar68._12_4_;
      auVar53 = vcmpps_avx(auVar53,auVar59,5);
      auVar25 = vmaxps_avx(local_1570,local_1540);
      auVar25 = vmaxps_avx(auVar25,auVar38);
      auVar25 = vcmpps_avx(auVar25,auVar68,2);
      auVar53 = vorps_avx(auVar53,auVar25);
      if ((((auVar53 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar53 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar53 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar53[0xf] < '\0'
         ) {
        auVar34._0_4_ = local_1650._0_4_ * fVar70;
        auVar34._4_4_ = local_1650._4_4_ * fVar73;
        auVar34._8_4_ = local_1650._8_4_ * fVar80;
        auVar34._12_4_ = local_1650._12_4_ * fVar83;
        auVar55._0_4_ = fVar86 * local_1660._0_4_;
        auVar55._4_4_ = fVar72 * local_1660._4_4_;
        auVar55._8_4_ = fVar75 * local_1660._8_4_;
        auVar55._12_4_ = fVar82 * local_1660._12_4_;
        auVar33 = vfmsub213ps_fma(local_1660,local_1560,auVar34);
        auVar60._0_4_ = auVar51._0_4_ * fVar76;
        auVar60._4_4_ = auVar51._4_4_ * fVar71;
        auVar60._8_4_ = auVar51._8_4_ * fVar74;
        auVar60._12_4_ = auVar51._12_4_ * fVar81;
        auVar69._0_4_ = fVar86 * auVar52._0_4_;
        auVar69._4_4_ = fVar72 * auVar52._4_4_;
        auVar69._8_4_ = fVar75 * auVar52._8_4_;
        auVar69._12_4_ = fVar82 * auVar52._12_4_;
        auVar52 = vfmsub213ps_fma(auVar52,auVar47,auVar60);
        auVar25 = vandps_avx(auVar34,auVar39);
        auVar38 = vandps_avx(auVar60,auVar39);
        auVar25 = vcmpps_avx(auVar25,auVar38,1);
        local_14d0 = vblendvps_avx(auVar52,auVar33,auVar25);
        auVar61._0_4_ = auVar26._0_4_ * fVar70;
        auVar61._4_4_ = auVar26._4_4_ * fVar73;
        auVar61._8_4_ = auVar26._8_4_ * fVar80;
        auVar61._12_4_ = auVar26._12_4_ * fVar83;
        auVar52 = vfmsub213ps_fma(auVar26,local_1560,auVar69);
        auVar35._0_4_ = local_1640._0_4_ * fVar76;
        auVar35._4_4_ = local_1640._4_4_ * fVar71;
        auVar35._8_4_ = local_1640._8_4_ * fVar74;
        auVar35._12_4_ = local_1640._12_4_ * fVar81;
        auVar33 = vfmsub213ps_fma(local_1650,auVar58,auVar35);
        auVar25 = vandps_avx(auVar35,auVar39);
        auVar38 = vandps_avx(auVar69,auVar39);
        auVar25 = vcmpps_avx(auVar25,auVar38,1);
        local_14c0 = vblendvps_avx(auVar52,auVar33,auVar25);
        auVar52 = vfmsub213ps_fma(local_1640,auVar47,auVar55);
        auVar51 = vfmsub213ps_fma(auVar51,auVar58,auVar61);
        auVar25 = vandps_avx(auVar55,auVar39);
        auVar38 = vandps_avx(auVar61,auVar39);
        auVar25 = vcmpps_avx(auVar25,auVar38,1);
        local_14b0 = vblendvps_avx(auVar51,auVar52,auVar25);
        auVar51._0_4_ = local_14b0._0_4_ * local_1620._4_4_;
        auVar51._4_4_ = local_14b0._4_4_ * local_1620._4_4_;
        auVar51._8_4_ = local_14b0._8_4_ * local_1620._4_4_;
        auVar51._12_4_ = local_14b0._12_4_ * local_1620._4_4_;
        auVar25 = vfmadd213ps_fma(auVar94,local_14c0,auVar51);
        auVar25 = vfmadd213ps_fma(local_1680,local_14d0,auVar25);
        auVar56._0_4_ = auVar25._0_4_ + auVar25._0_4_;
        auVar56._4_4_ = auVar25._4_4_ + auVar25._4_4_;
        auVar56._8_4_ = auVar25._8_4_ + auVar25._8_4_;
        auVar56._12_4_ = auVar25._12_4_ + auVar25._12_4_;
        auVar52._0_4_ = local_14b0._0_4_ * fVar93;
        auVar52._4_4_ = local_14b0._4_4_ * fVar101;
        auVar52._8_4_ = local_14b0._8_4_ * fVar108;
        auVar52._12_4_ = local_14b0._12_4_ * fVar65;
        auVar25 = vfmadd213ps_fma(local_1610,local_14c0,auVar52);
        auVar38 = vfmadd213ps_fma(local_1600,local_14d0,auVar25);
        auVar25 = vrcpps_avx(auVar56);
        auVar78._8_4_ = 0x3f800000;
        auVar78._0_8_ = 0x3f8000003f800000;
        auVar78._12_4_ = 0x3f800000;
        auVar51 = vfnmadd213ps_fma(auVar25,auVar56,auVar78);
        auVar25 = vfmadd132ps_fma(auVar51,auVar25,auVar25);
        local_14e0._0_4_ = auVar25._0_4_ * (auVar38._0_4_ + auVar38._0_4_);
        local_14e0._4_4_ = auVar25._4_4_ * (auVar38._4_4_ + auVar38._4_4_);
        local_14e0._8_4_ = auVar25._8_4_ * (auVar38._8_4_ + auVar38._8_4_);
        local_14e0._12_4_ = auVar25._12_4_ * (auVar38._12_4_ + auVar38._12_4_);
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x60);
        auVar62._4_4_ = uVar1;
        auVar62._0_4_ = uVar1;
        auVar62._8_4_ = uVar1;
        auVar62._12_4_ = uVar1;
        auVar25 = vcmpps_avx(auVar62,local_14e0,2);
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar79._4_4_ = uVar1;
        auVar79._0_4_ = uVar1;
        auVar79._8_4_ = uVar1;
        auVar79._12_4_ = uVar1;
        auVar57 = ZEXT1664(auVar79);
        auVar38 = vcmpps_avx(local_14e0,auVar79,2);
        auVar25 = vandps_avx(auVar38,auVar25);
        auVar38 = auVar53 & auVar25;
        if ((((auVar38 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar38 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar38 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar38[0xf] < '\0') {
          auVar53 = vandps_avx(auVar53,auVar25);
          auVar25 = vcmpps_avx(auVar56,_DAT_01f45a50,4);
          local_1510 = vandps_avx(auVar53,auVar25);
          uVar17 = vmovmskps_avx(local_1510);
          if (uVar17 != 0) {
            lVar14 = lVar14 + uVar23;
            uStack_1688 = auVar94._8_8_;
            local_1690 = lVar14;
            local_1520 = &local_1699;
            auVar53 = vrcpps_avx(local_1530);
            auVar40._8_4_ = 0x3f800000;
            auVar40._0_8_ = 0x3f8000003f800000;
            auVar40._12_4_ = 0x3f800000;
            auVar25 = vfnmadd213ps_fma(local_1530,auVar53,auVar40);
            auVar25 = vfmadd132ps_fma(auVar25,auVar53,auVar53);
            auVar36._8_4_ = 0x219392ef;
            auVar36._0_8_ = 0x219392ef219392ef;
            auVar36._12_4_ = 0x219392ef;
            auVar53 = vcmpps_avx(local_1580,auVar36,5);
            auVar53 = vandps_avx(auVar53,auVar25);
            auVar28._0_4_ = local_1550 * auVar53._0_4_;
            auVar28._4_4_ = fStack_154c * auVar53._4_4_;
            auVar28._8_4_ = fStack_1548 * auVar53._8_4_;
            auVar28._12_4_ = fStack_1544 * auVar53._12_4_;
            local_1500 = vminps_avx(auVar28,auVar40);
            auVar29._0_4_ = auVar53._0_4_ * local_1540._0_4_;
            auVar29._4_4_ = auVar53._4_4_ * local_1540._4_4_;
            auVar29._8_4_ = auVar53._8_4_ * local_1540._8_4_;
            auVar29._12_4_ = auVar53._12_4_ * local_1540._12_4_;
            local_14f0 = vminps_avx(auVar29,auVar40);
            uVar13 = (ulong)(uVar17 & 0xff);
            local_1620 = context->scene;
            pSVar20 = context->scene;
            do {
              uVar18 = 0;
              for (uVar7 = uVar13; (uVar7 & 1) == 0; uVar7 = uVar7 >> 1 | 0x8000000000000000) {
                uVar18 = uVar18 + 1;
              }
              uVar17 = *(uint *)(lVar14 + 0x120 + uVar18 * 4);
              pGVar16 = (pSVar20->geometries).items[uVar17].ptr;
              if ((pGVar16->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                local_1680._0_8_ = uVar18;
                local_1600._0_8_ = uVar13;
                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                   (pGVar16->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_1610._0_8_ = pGVar16;
                  uVar13 = (ulong)(uint)((int)uVar18 * 4);
                  local_12c0 = *(undefined4 *)(local_1500 + uVar13);
                  local_12a0 = *(undefined4 *)(local_14f0 + uVar13);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_14e0 + uVar13);
                  local_15d0.context = context->user;
                  uVar1 = *(undefined4 *)(local_1690 + 0x130 + uVar13);
                  local_1280._4_4_ = uVar1;
                  local_1280._0_4_ = uVar1;
                  local_1280._8_4_ = uVar1;
                  local_1280._12_4_ = uVar1;
                  local_1280._16_4_ = uVar1;
                  local_1280._20_4_ = uVar1;
                  local_1280._24_4_ = uVar1;
                  local_1280._28_4_ = uVar1;
                  uVar1 = *(undefined4 *)(local_14d0 + uVar13);
                  uVar2 = *(undefined4 *)(local_14c0 + uVar13);
                  local_1300._4_4_ = uVar2;
                  local_1300._0_4_ = uVar2;
                  local_1300._8_4_ = uVar2;
                  local_1300._12_4_ = uVar2;
                  local_1300._16_4_ = uVar2;
                  local_1300._20_4_ = uVar2;
                  local_1300._24_4_ = uVar2;
                  local_1300._28_4_ = uVar2;
                  uVar2 = *(undefined4 *)(local_14b0 + uVar13);
                  local_12e0._4_4_ = uVar2;
                  local_12e0._0_4_ = uVar2;
                  local_12e0._8_4_ = uVar2;
                  local_12e0._12_4_ = uVar2;
                  local_12e0._16_4_ = uVar2;
                  local_12e0._20_4_ = uVar2;
                  local_12e0._24_4_ = uVar2;
                  local_12e0._28_4_ = uVar2;
                  local_1260._4_4_ = uVar17;
                  local_1260._0_4_ = uVar17;
                  local_1260._8_4_ = uVar17;
                  local_1260._12_4_ = uVar17;
                  local_1260._16_4_ = uVar17;
                  local_1260._20_4_ = uVar17;
                  local_1260._24_4_ = uVar17;
                  local_1260._28_4_ = uVar17;
                  local_1320[0] = (RTCHitN)(char)uVar1;
                  local_1320[1] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_1320[2] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_1320[3] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  local_1320[4] = (RTCHitN)(char)uVar1;
                  local_1320[5] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_1320[6] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_1320[7] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  local_1320[8] = (RTCHitN)(char)uVar1;
                  local_1320[9] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_1320[10] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_1320[0xb] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  local_1320[0xc] = (RTCHitN)(char)uVar1;
                  local_1320[0xd] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_1320[0xe] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_1320[0xf] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  local_1320[0x10] = (RTCHitN)(char)uVar1;
                  local_1320[0x11] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_1320[0x12] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_1320[0x13] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  local_1320[0x14] = (RTCHitN)(char)uVar1;
                  local_1320[0x15] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_1320[0x16] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_1320[0x17] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  local_1320[0x18] = (RTCHitN)(char)uVar1;
                  local_1320[0x19] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_1320[0x1a] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_1320[0x1b] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  local_1320[0x1c] = (RTCHitN)(char)uVar1;
                  local_1320[0x1d] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_1320[0x1e] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_1320[0x1f] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  uStack_12bc = local_12c0;
                  uStack_12b8 = local_12c0;
                  uStack_12b4 = local_12c0;
                  uStack_12b0 = local_12c0;
                  uStack_12ac = local_12c0;
                  uStack_12a8 = local_12c0;
                  uStack_12a4 = local_12c0;
                  uStack_129c = local_12a0;
                  uStack_1298 = local_12a0;
                  uStack_1294 = local_12a0;
                  uStack_1290 = local_12a0;
                  uStack_128c = local_12a0;
                  uStack_1288 = local_12a0;
                  uStack_1284 = local_12a0;
                  auVar30 = vpcmpeqd_avx2(local_1260,local_1260);
                  uStack_123c = (local_15d0.context)->instID[0];
                  local_1240 = uStack_123c;
                  uStack_1238 = uStack_123c;
                  uStack_1234 = uStack_123c;
                  uStack_1230 = uStack_123c;
                  uStack_122c = uStack_123c;
                  uStack_1228 = uStack_123c;
                  uStack_1224 = uStack_123c;
                  uStack_121c = (local_15d0.context)->instPrimID[0];
                  local_1220 = uStack_121c;
                  uStack_1218 = uStack_121c;
                  uStack_1214 = uStack_121c;
                  uStack_1210 = uStack_121c;
                  uStack_120c = uStack_121c;
                  uStack_1208 = uStack_121c;
                  uStack_1204 = uStack_121c;
                  local_15a0 = local_14a0;
                  local_15d0.valid = (int *)local_15a0;
                  local_15d0.geometryUserPtr = pGVar16->userPtr;
                  local_15d0.hit = local_1320;
                  local_15d0.N = 8;
                  local_15d0.ray = (RTCRayN *)ray;
                  if (pGVar16->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    local_1640._0_8_ = k;
                    local_1630._0_8_ = ray;
                    local_1650._0_8_ = puVar19;
                    local_1660._0_8_ = uVar21;
                    local_1670 = auVar57._0_16_;
                    auVar30 = ZEXT1632(auVar30._0_16_);
                    (*pGVar16->occlusionFilterN)(&local_15d0);
                    auVar57 = ZEXT1664(local_1670);
                    auVar30 = vpcmpeqd_avx2(auVar30,auVar30);
                    k = local_1640._0_8_;
                    pGVar16 = (Geometry *)local_1610._0_8_;
                    puVar19 = (ulong *)local_1650._0_8_;
                    ray = (RayK<8> *)local_1630._0_8_;
                    uVar21 = local_1660._0_8_;
                  }
                  auVar4 = vpcmpeqd_avx2(local_15a0,_DAT_01f7b000);
                  auVar6 = auVar30 & ~auVar4;
                  if ((((((((auVar6 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar6 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar6 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar6 >> 0x7f,0) == '\0') &&
                        (auVar6 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar6 >> 0xbf,0) == '\0') &&
                      (auVar6 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar6[0x1f]) {
                    auVar4 = auVar4 ^ auVar30;
                  }
                  else {
                    p_Var3 = context->args->filter;
                    if ((p_Var3 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar16->field_8).field_0x2 & 0x40) != 0)))) {
                      local_1640._0_8_ = k;
                      local_1630._0_8_ = ray;
                      local_1650._0_8_ = puVar19;
                      local_1660._0_8_ = uVar21;
                      local_1670 = auVar57._0_16_;
                      auVar30 = ZEXT1632(auVar30._0_16_);
                      (*p_Var3)(&local_15d0);
                      auVar57 = ZEXT1664(local_1670);
                      auVar30 = vpcmpeqd_avx2(auVar30,auVar30);
                      k = local_1640._0_8_;
                      puVar19 = (ulong *)local_1650._0_8_;
                      ray = (RayK<8> *)local_1630._0_8_;
                      uVar21 = local_1660._0_8_;
                    }
                    auVar6 = vpcmpeqd_avx2(local_15a0,_DAT_01f7b000);
                    auVar4 = auVar6 ^ auVar30;
                    auVar41._8_4_ = 0xff800000;
                    auVar41._0_8_ = 0xff800000ff800000;
                    auVar41._12_4_ = 0xff800000;
                    auVar41._16_4_ = 0xff800000;
                    auVar41._20_4_ = 0xff800000;
                    auVar41._24_4_ = 0xff800000;
                    auVar41._28_4_ = 0xff800000;
                    auVar30 = vblendvps_avx(auVar41,*(undefined1 (*) [32])(local_15d0.ray + 0x100),
                                            auVar6);
                    *(undefined1 (*) [32])(local_15d0.ray + 0x100) = auVar30;
                  }
                  if ((((((((auVar4 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar4 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar4 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar4 >> 0x7f,0) == '\0') &&
                        (auVar4 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar4 >> 0xbf,0) == '\0') &&
                      (auVar4 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar4[0x1f]) {
                    *(int *)(ray + k * 4 + 0x100) = auVar57._0_4_;
                    uVar13 = local_1600._0_8_ ^ 1L << (local_1680._0_8_ & 0x3f);
                    lVar14 = local_1690;
                    goto LAB_016cfd68;
                  }
                }
                *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
                goto LAB_016cfee0;
              }
              uVar13 = uVar13 ^ 1L << (uVar18 & 0x3f);
              lVar14 = local_1690;
LAB_016cfd68:
              pSVar20 = local_1620;
            } while (uVar13 != 0);
          }
        }
      }
      auVar57 = ZEXT3264(local_1340);
      auVar63 = ZEXT3264(local_1360);
      auVar64 = ZEXT3264(local_1380);
      auVar118 = ZEXT3264(local_1460);
      auVar119 = ZEXT3264(local_1480);
      fVar65 = local_13a0;
      fVar70 = fStack_139c;
      fVar71 = fStack_1398;
      fVar72 = fStack_1394;
      fVar73 = fStack_1390;
      fVar74 = fStack_138c;
      fVar75 = fStack_1388;
      fVar76 = local_13c0;
      fVar80 = fStack_13bc;
      fVar81 = fStack_13b8;
      fVar82 = fStack_13b4;
      fVar83 = fStack_13b0;
      fVar84 = fStack_13ac;
      fVar85 = fStack_13a8;
      fVar86 = local_13e0;
      fVar87 = fStack_13dc;
      fVar88 = fStack_13d8;
      fVar89 = fStack_13d4;
      fVar90 = fStack_13d0;
      fVar91 = fStack_13cc;
      fVar92 = fStack_13c8;
      fVar93 = local_1400;
      fVar95 = fStack_13fc;
      fVar96 = fStack_13f8;
      fVar97 = fStack_13f4;
      fVar98 = fStack_13f0;
      fVar99 = fStack_13ec;
      fVar100 = fStack_13e8;
      fVar101 = local_1420;
      fVar102 = fStack_141c;
      fVar103 = fStack_1418;
      fVar104 = fStack_1414;
      fVar105 = fStack_1410;
      fVar106 = fStack_140c;
      fVar107 = fStack_1408;
      fVar108 = local_1440;
      fVar111 = fStack_143c;
      fVar112 = fStack_1438;
      fVar113 = fStack_1434;
      fVar114 = fStack_1430;
      fVar115 = fStack_142c;
      fVar116 = fStack_1428;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }